

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

bool mightBeRichTextImpl<QLatin1String>(QLatin1String text)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  undefined2 uVar5;
  int iVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  qsizetype pos;
  char32_t ucs4;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QLatin1StringView other_00;
  QStringView element;
  QLatin1StringView local_270;
  QLatin1String text_local;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  pcVar9 = text.m_data;
  text_local.m_size = text.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  text_local.m_data = pcVar9;
  if (text_local.m_size == 0) {
LAB_00459829:
    bVar3 = false;
  }
  else {
    lVar11 = 0;
    lVar10 = text_local.m_size;
    if (text_local.m_size < 1) {
      lVar10 = lVar11;
    }
    while ((pos = lVar10, lVar10 != lVar11 &&
           (bVar3 = QChar::isSpace((uint)(byte)pcVar9[lVar11]), pos = lVar11, bVar3))) {
      lVar11 = lVar11 + 1;
    }
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase._0_16_ =
         QLatin1String::mid(&text_local,pos,5);
    other.m_data = "<?xml";
    other.m_size = 5;
    iVar6 = QLatin1String::compare((QLatin1String *)&local_250,other,CaseSensitive);
    pcVar9 = text_local.m_data;
    qVar8 = text_local.m_size;
    if (iVar6 == 0) {
      qVar7 = text_local.m_size;
      if (text_local.m_size < pos) {
        qVar7 = pos;
      }
      for (; (lVar10 = qVar7, pos < text_local.m_size &&
             (((text_local.m_data[pos] != '?' || (text_local.m_size <= pos + 2)) ||
              (lVar10 = pos + 2, text_local.m_data[pos + 1] != '>')))); pos = pos + 1) {
      }
      qVar7 = text_local.m_size;
      if (text_local.m_size < lVar10) {
        qVar7 = lVar10;
      }
      while ((pos = qVar7, lVar10 < qVar8 &&
             (bVar3 = QChar::isSpace((uint)(byte)pcVar9[lVar10]), pos = lVar10, bVar3))) {
        lVar10 = lVar10 + 1;
      }
    }
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase._0_16_ =
         QLatin1String::mid(&text_local,pos,5);
    other_00.m_data = "<!doc";
    other_00.m_size = 5;
    iVar6 = QLatin1String::compare((QLatin1String *)&local_250,other_00,CaseInsensitive);
    if (iVar6 == 0) {
      bVar3 = true;
    }
    else {
      do {
        do {
          bVar3 = pos < text_local.m_size;
          if (text_local.m_size <= pos) goto LAB_0045982b;
          cVar1 = text_local.m_data[pos];
          if (cVar1 == '\n') goto LAB_00459829;
          if (cVar1 == '<') {
            qVar8 = QLatin1String::indexOf(&text_local,(QChar)0x3e,pos,CaseSensitive);
            if (qVar8 < 0) goto LAB_00459829;
            memset((storage_type_conflict *)((long)&local_250 + 0x18U),0xaa,0x200);
            local_250.super_QVLABase<char16_t>.super_QVLABaseBase._0_16_ = ZEXT816(0x100);
            local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr =
                 (storage_type_conflict *)((long)&local_250 + 0x18U);
            goto LAB_004597a1;
          }
          pos = pos + 1;
        } while (cVar1 != '&');
        local_250.super_QVLABase<char16_t>.super_QVLABaseBase._0_16_ =
             QLatin1String::mid(&text_local,pos,3);
        local_270.m_size = 3;
        local_270.m_data = "lt;";
        bVar4 = comparesEqual((QLatin1StringView *)&local_250,&local_270);
      } while (!bVar4);
    }
  }
  goto LAB_0045982b;
  while( true ) {
    pcVar9 = (char *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
    ucs4 = (char32_t)bVar2;
    bVar3 = QChar::isSpace(ucs4);
    if (pcVar9 == (char *)0x0) {
      bVar3 = !bVar3;
    }
    else if ((bVar3) || ((bVar3 = true, ucs4 == L'/' && ((2 - qVar8) + pos == 1))))
    goto LAB_00459857;
    if ((bool)((ucs4 != L'!' || pcVar9 != (char *)0x0) & bVar3)) break;
LAB_004597a1:
    pos = pos + 1;
    if (qVar8 <= pos) {
      pcVar9 = (char *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
LAB_00459857:
      element.m_data =
           (storage_type_conflict *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
      element.m_size = (qsizetype)pcVar9;
      iVar6 = QTextHtmlParser::lookupElement(element);
      bVar3 = iVar6 != -1;
      goto LAB_0045986b;
    }
    bVar2 = text_local.m_data[pos];
    bVar3 = QChar::isDigit((uint)bVar2);
    if ((bVar3) || (bVar3 = QChar::isLetter((uint)bVar2), bVar3)) {
      uVar5 = QChar::toLower((uint)bVar2);
      local_270.m_size = CONCAT62(local_270.m_size._2_6_,uVar5);
      QVarLengthArray<char16_t,_256LL>::append(&local_250,(char16_t *)&local_270);
      goto LAB_004597a1;
    }
  }
  bVar3 = false;
LAB_0045986b:
  QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(&local_250);
LAB_0045982b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

static bool mightBeRichTextImpl(T text)
{
    if (text.isEmpty())
        return false;
    qsizetype start = 0;

    while (start < text.size() && QChar(text.at(start)).isSpace())
        ++start;

    // skip a leading <?xml ... ?> as for example with xhtml
    if (text.mid(start, 5).compare("<?xml"_L1) == 0) {
        while (start < text.size()) {
            if (text.at(start) == u'?'
                && start + 2 < text.size()
                && text.at(start + 1) == u'>') {
                start += 2;
                break;
            }
            ++start;
        }

        while (start < text.size() && QChar(text.at(start)).isSpace())
            ++start;
    }

    if (text.mid(start, 5).compare("<!doc"_L1, Qt::CaseInsensitive) == 0)
        return true;
    qsizetype open = start;
    while (open < text.size() && text.at(open) != u'<'
            && text.at(open) != u'\n') {
        if (text.at(open) == u'&' && text.mid(open + 1, 3) == "lt;"_L1)
            return true; // support desperate attempt of user to see <...>
        ++open;
    }
    if (open < text.size() && text.at(open) == u'<') {
        const qsizetype close = text.indexOf(u'>', open);
        if (close > -1) {
            QVarLengthArray<char16_t> tag;
            for (qsizetype i = open + 1; i < close; ++i) {
                const auto current = QChar(text[i]);
                if (current.isDigit() || current.isLetter())
                    tag.append(current.toLower().unicode());
                else if (!tag.isEmpty() && current.isSpace())
                    break;
                else if (!tag.isEmpty() && current == u'/' && i + 1 == close)
                    break;
                else if (!current.isSpace() && (!tag.isEmpty() || current != u'!'))
                    return false; // that's not a tag
            }
#ifndef QT_NO_TEXTHTMLPARSER
            return QTextHtmlParser::lookupElement(tag) != -1;
#else
            return false;
#endif // QT_NO_TEXTHTMLPARSER
        }
    }
    return false;
}